

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_cli.c
# Opt level: O1

void isobusfs_cli_prepare_response_event(isobusfs_event *event,int sock,uint8_t fs_function)

{
  timespec current_time;
  timespec local_20;
  
  event->fd = sock;
  event->fs_function = fs_function;
  clock_gettime(0,&local_20);
  (event->timeout).tv_sec = local_20.tv_sec + 1;
  (event->timeout).tv_nsec = local_20.tv_nsec;
  if (999999999 < local_20.tv_nsec) {
    (event->timeout).tv_nsec = local_20.tv_nsec + -1000000000;
    (event->timeout).tv_sec = local_20.tv_sec + 2;
  }
  event->one_shot = true;
  return;
}

Assistant:

void isobusfs_cli_prepare_response_event(struct isobusfs_event *event, int sock,
					 uint8_t fs_function)
{
	struct timespec current_time, timeout_timespec;

	event->fd = sock;
	event->fs_function = fs_function;

	/* Calculate the timeout */
	clock_gettime(CLOCK_REALTIME, &current_time);
	timeout_timespec = ms_to_timespec(ISOBUSFS_CLI_DEFAULT_WAIT_TIMEOUT_MS);
	event->timeout.tv_sec = current_time.tv_sec + timeout_timespec.tv_sec;
	event->timeout.tv_nsec = current_time.tv_nsec + timeout_timespec.tv_nsec;

	/* Adjust for nanosecond overflow */
	if (event->timeout.tv_nsec >= 1000000000) {
		event->timeout.tv_nsec -= 1000000000;
		event->timeout.tv_sec++;
	}

	event->one_shot = true;
}